

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_levels_utils.c
# Opt level: O3

int QuantizeLevels(uint8_t *data,int width,int height,int num_levels,uint64_t *sse)

{
  double *pdVar1;
  byte bVar2;
  double dVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined4 uVar20;
  undefined4 uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int q_level [256];
  int freq [256];
  double inv_q_level [256];
  double q_sum [256];
  double q_count [256];
  uint local_2038 [256];
  int local_1c38 [256];
  double local_1838 [256];
  double local_1038 [256];
  double local_838 [257];
  
  memset(local_1c38,0,0x400);
  memset(local_2038,0,0x400);
  memset(local_1838,0,0x800);
  iVar13 = 0;
  if ((data != (uint8_t *)0x0) &&
     (iVar13 = 0, 0xffffff00 < num_levels - 0x101U && (0 < height && 0 < width))) {
    iVar13 = height * width;
    lVar15 = (long)iVar13;
    if (iVar13 == 0) {
      uVar16 = 0xff;
      iVar5 = 0;
      uVar7 = 0;
    }
    else {
      uVar7 = 0;
      uVar16 = 0xff;
      lVar10 = 0;
      iVar5 = 0;
      do {
        bVar2 = data[lVar10];
        iVar5 = iVar5 + (uint)(local_1c38[bVar2] == 0);
        uVar12 = (uint)bVar2;
        if (bVar2 <= uVar16) {
          uVar16 = uVar12;
        }
        if ((uint)uVar7 <= uVar12) {
          uVar7 = (ulong)uVar12;
        }
        local_1c38[bVar2] = local_1c38[bVar2] + 1;
        lVar10 = lVar10 + 1;
      } while (lVar15 != lVar10);
    }
    if (num_levels < iVar5) {
      auVar19._8_4_ = iVar13 >> 0x1f;
      auVar19._0_8_ = lVar15;
      auVar19._12_4_ = 0x45300000;
      uVar12 = (uint)uVar7;
      if (0 < num_levels) {
        lVar10 = (ulong)(uint)num_levels - 1;
        auVar22._8_4_ = (int)lVar10;
        auVar22._0_8_ = lVar10;
        auVar22._12_4_ = (int)((ulong)lVar10 >> 0x20);
        uVar11 = 0;
        auVar22 = auVar22 ^ _DAT_001547b0;
        auVar23 = _DAT_001545c0;
        do {
          auVar24 = auVar23 ^ _DAT_001547b0;
          if ((bool)(~(auVar24._4_4_ == auVar22._4_4_ && auVar22._0_4_ < auVar24._0_4_ ||
                      auVar22._4_4_ < auVar24._4_4_) & 1)) {
            local_1838[uVar11] =
                 ((double)(int)uVar11 * (double)(int)(uVar12 - uVar16)) / (double)(num_levels + -1)
                 + (double)uVar16;
          }
          if ((auVar24._12_4_ != auVar22._12_4_ || auVar24._8_4_ <= auVar22._8_4_) &&
              auVar24._12_4_ <= auVar22._12_4_) {
            local_1838[uVar11 + 1] =
                 ((double)((int)uVar11 + 1) * (double)(int)(uVar12 - uVar16)) /
                 (double)(num_levels + -1) + (double)uVar16;
          }
          uVar11 = uVar11 + 2;
          lVar10 = auVar23._8_8_;
          auVar23._0_8_ = auVar23._0_8_ + 2;
          auVar23._8_8_ = lVar10 + 2;
        } while ((num_levels + 1U & 0x3fe) != uVar11);
      }
      uVar17 = num_levels - 1;
      uVar11 = (ulong)uVar16;
      local_2038[uVar11] = 0;
      local_2038[uVar7] = uVar17;
      iVar5 = 0;
      uVar20 = 0x2a16a1b1;
      uVar21 = 0x47d2ced3;
      do {
        memset(local_1038,0,0x800);
        memset(local_838,0,0x800);
        if (uVar16 <= uVar12) {
          uVar9 = 0;
          uVar7 = uVar11;
          do {
            lVar10 = (long)(int)uVar9;
            uVar14 = uVar17;
            if ((int)uVar17 < (int)uVar9) {
              uVar14 = uVar9;
            }
            uVar8 = uVar9 - 1;
            do {
              uVar9 = uVar14;
              if ((int)uVar17 <= lVar10) break;
              pdVar1 = local_1838 + lVar10;
              lVar4 = lVar10 + 1;
              lVar10 = lVar10 + 1;
              uVar9 = uVar8 + 1;
              uVar8 = uVar9;
            } while (*pdVar1 + local_1838[lVar4] < (double)((int)uVar7 * 2));
            iVar6 = local_1c38[uVar7];
            if (0 < iVar6) {
              local_1038[(int)uVar9] = (double)((int)uVar7 * iVar6) + local_1038[(int)uVar9];
              local_838[(int)uVar9] = (double)iVar6 + local_838[(int)uVar9];
            }
            local_2038[uVar7] = uVar9;
            uVar7 = uVar7 + 1;
          } while (uVar12 + 1 != (int)uVar7);
        }
        if (2 < num_levels) {
          uVar7 = 1;
          do {
            if (0.0 < local_838[uVar7]) {
              local_1838[uVar7] = local_1038[uVar7] / local_838[uVar7];
            }
            uVar7 = uVar7 + 1;
          } while (uVar17 != uVar7);
        }
        dVar18 = 0.0;
        uVar7 = uVar11;
        iVar6 = (uVar12 + 1) - uVar16;
        if (uVar16 <= uVar12) {
          do {
            dVar3 = (double)(int)uVar7 - local_1838[(int)local_2038[uVar7]];
            dVar18 = dVar18 + (double)local_1c38[uVar7] * dVar3 * dVar3;
            iVar6 = iVar6 + -1;
            uVar7 = uVar7 + 1;
          } while (iVar6 != 0);
        }
        if ((double)CONCAT44(uVar21,uVar20) - dVar18 <
            ((auVar19._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,iVar13) - 4503599627370496.0)) * 0.0001) break;
        iVar5 = iVar5 + 1;
        uVar20 = SUB84(dVar18,0);
        uVar21 = (undefined4)((ulong)dVar18 >> 0x20);
      } while (iVar5 != 6);
      if (uVar16 <= uVar12) {
        lVar10 = 0;
        do {
          *(char *)((long)local_1038 + lVar10 + uVar11) =
               (char)(int)(local_1838[(int)local_2038[uVar11 + lVar10]] + 0.5);
          lVar10 = lVar10 + 1;
        } while ((uVar12 - uVar16) + 1 != (int)lVar10);
      }
      if (iVar13 != 0) {
        lVar10 = 0;
        do {
          data[lVar10] = *(uint8_t *)((long)local_1038 + (ulong)data[lVar10]);
          lVar10 = lVar10 + 1;
        } while (lVar15 != lVar10);
      }
      uVar7 = (long)(dVar18 - 9.223372036854776e+18) & (long)dVar18 >> 0x3f | (long)dVar18;
    }
    else {
      uVar7 = 0;
    }
    iVar13 = 1;
    if (sse != (uint64_t *)0x0) {
      *sse = uVar7;
    }
  }
  return iVar13;
}

Assistant:

int QuantizeLevels(uint8_t* const data, int width, int height,
                   int num_levels, uint64_t* const sse) {
  int freq[NUM_SYMBOLS] = { 0 };
  int q_level[NUM_SYMBOLS] = { 0 };
  double inv_q_level[NUM_SYMBOLS] = { 0 };
  int min_s = 255, max_s = 0;
  const size_t data_size = height * width;
  int i, num_levels_in, iter;
  double last_err = 1.e38, err = 0.;
  const double err_threshold = ERROR_THRESHOLD * data_size;

  if (data == NULL) {
    return 0;
  }

  if (width <= 0 || height <= 0) {
    return 0;
  }

  if (num_levels < 2 || num_levels > 256) {
    return 0;
  }

  {
    size_t n;
    num_levels_in = 0;
    for (n = 0; n < data_size; ++n) {
      num_levels_in += (freq[data[n]] == 0);
      if (min_s > data[n]) min_s = data[n];
      if (max_s < data[n]) max_s = data[n];
      ++freq[data[n]];
    }
  }

  if (num_levels_in <= num_levels) goto End;  // nothing to do!

  // Start with uniformly spread centroids.
  for (i = 0; i < num_levels; ++i) {
    inv_q_level[i] = min_s + (double)(max_s - min_s) * i / (num_levels - 1);
  }

  // Fixed values. Won't be changed.
  q_level[min_s] = 0;
  q_level[max_s] = num_levels - 1;
  assert(inv_q_level[0] == min_s);
  assert(inv_q_level[num_levels - 1] == max_s);

  // k-Means iterations.
  for (iter = 0; iter < MAX_ITER; ++iter) {
    double q_sum[NUM_SYMBOLS] = { 0 };
    double q_count[NUM_SYMBOLS] = { 0 };
    int s, slot = 0;

    // Assign classes to representatives.
    for (s = min_s; s <= max_s; ++s) {
      // Keep track of the nearest neighbour 'slot'
      while (slot < num_levels - 1 &&
             2 * s > inv_q_level[slot] + inv_q_level[slot + 1]) {
        ++slot;
      }
      if (freq[s] > 0) {
        q_sum[slot] += s * freq[s];
        q_count[slot] += freq[s];
      }
      q_level[s] = slot;
    }

    // Assign new representatives to classes.
    if (num_levels > 2) {
      for (slot = 1; slot < num_levels - 1; ++slot) {
        const double count = q_count[slot];
        if (count > 0.) {
          inv_q_level[slot] = q_sum[slot] / count;
        }
      }
    }

    // Compute convergence error.
    err = 0.;
    for (s = min_s; s <= max_s; ++s) {
      const double error = s - inv_q_level[q_level[s]];
      err += freq[s] * error * error;
    }

    // Check for convergence: we stop as soon as the error is no
    // longer improving.
    if (last_err - err < err_threshold) break;
    last_err = err;
  }

  // Remap the alpha plane to quantized values.
  {
    // double->int rounding operation can be costly, so we do it
    // once for all before remapping. We also perform the data[] -> slot
    // mapping, while at it (avoid one indirection in the final loop).
    uint8_t map[NUM_SYMBOLS];
    int s;
    size_t n;
    for (s = min_s; s <= max_s; ++s) {
      const int slot = q_level[s];
      map[s] = (uint8_t)(inv_q_level[slot] + .5);
    }
    // Final pass.
    for (n = 0; n < data_size; ++n) {
      data[n] = map[data[n]];
    }
  }
 End:
  // Store sum of squared error if needed.
  if (sse != NULL) *sse = (uint64_t)err;

  return 1;
}